

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_stmt_t * gs_parse_stmt_block(gs_parser_t *parser)

{
  gs_token_t token_00;
  vec_gs_stmt_t stmts_00;
  _Bool _Var1;
  int iVar2;
  gs_stmt_t *pgVar3;
  gs_stmt_t *stmt_1;
  gs_stmt_t *stmt;
  gs_token_t token;
  vec_gs_stmt_t stmts;
  gs_parser_t *parser_local;
  
  stmts.alloc_category = (char *)parser;
  memset(&token.field_3,0,0x18);
  stmts._8_8_ = anon_var_dwarf_24ba4;
  gs_peek((gs_token_t *)&stmt,(gs_parser_t *)stmts.alloc_category);
  stmt_1 = (gs_stmt_t *)0x0;
  while (_Var1 = gs_eat_char((gs_parser_t *)stmts.alloc_category,'}'), ((_Var1 ^ 0xffU) & 1) != 0) {
    pgVar3 = gs_parse_stmt((gs_parser_t *)stmts.alloc_category);
    if ((stmts.alloc_category[0x1c] & 1U) != 0) goto LAB_001578ce;
    iVar2 = vec_expand_(&token.field_3.symbol,(int *)&stmts,(int *)((long)&stmts.data + 4),8,
                        (char *)stmts._8_8_);
    if (iVar2 == 0) {
      *(gs_stmt_t **)(token.field_3.symbol + (long)(int)stmts.data * 8) = pgVar3;
      stmts.data._0_4_ = (int)stmts.data + 1;
    }
  }
  stmts_00.capacity = stmts.data._4_4_;
  stmts_00.length = (int)stmts.data;
  token_00.col = token.type;
  token_00._12_4_ = token.line;
  token_00._0_8_ = stmt;
  token_00.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
  stmts_00.data = (gs_stmt_t **)token.field_3.symbol;
  stmts_00.alloc_category = (char *)stmts._8_8_;
  stmt_1 = gs_stmt_block_new((gs_parser_t *)stmts.alloc_category,token_00,stmts_00);
LAB_001578ce:
  golf_free_tracked(token.field_3.symbol);
  return stmt_1;
}

Assistant:

static gs_stmt_t *gs_parse_stmt_block(gs_parser_t *parser) {
    vec_gs_stmt_t stmts;
    vec_init(&stmts, "script/parser");

    gs_token_t token = gs_peek(parser);
    gs_stmt_t *stmt = NULL;

    while (!gs_eat_char(parser, '}')) {
        gs_stmt_t *stmt = gs_parse_stmt(parser);
        if (parser->error) goto cleanup;

        vec_push(&stmts, stmt);
    }

    stmt = gs_stmt_block_new(parser, token, stmts);

cleanup:
    vec_deinit(&stmts);
    return stmt;
}